

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::ContinuousAssignSymbol::getAssignment(ContinuousAssignSymbol *this)

{
  LookupLocation lookupLocation;
  int iVar1;
  ExpressionSyntax *pEVar2;
  undefined4 extraout_var;
  bitmask<slang::ast::ASTFlags> in_RDI;
  ASTContext context;
  SyntaxNode *syntax;
  Scope *scope;
  Symbol *scope_00;
  ASTContext *in_stack_ffffffffffffff68;
  socklen_t __len;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff80;
  sockaddr local_58 [3];
  SyntaxNode *local_20;
  Symbol *local_18;
  Expression *local_8;
  
  if (*(long *)(in_RDI.m_bits + 0x40) == 0) {
    local_18 = (Symbol *)Symbol::getParentScope((Symbol *)in_RDI.m_bits);
    local_20 = Symbol::getSyntax((Symbol *)in_RDI.m_bits);
    scope_00 = local_18;
    LookupLocation::after(local_18);
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff80,NonProcedural);
    lookupLocation._8_8_ = in_stack_ffffffffffffff80.m_bits;
    lookupLocation.scope = (Scope *)in_stack_ffffffffffffff78.m_bits;
    ASTContext::ASTContext(in_stack_ffffffffffffff68,(Scope *)scope_00,lookupLocation,in_RDI);
    __len = (socklen_t)in_stack_ffffffffffffff78.m_bits;
    pEVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(local_20);
    iVar1 = (int)pEVar2;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78,AssignmentAllowed);
    iVar1 = Expression::bind(iVar1,local_58,__len);
    *(ulong *)(in_RDI.m_bits + 0x40) = CONCAT44(extraout_var,iVar1);
    local_8 = *(Expression **)(in_RDI.m_bits + 0x40);
  }
  else {
    local_8 = *(Expression **)(in_RDI.m_bits + 0x40);
  }
  return local_8;
}

Assistant:

const Expression& ContinuousAssignSymbol::getAssignment() const {
    if (assign)
        return *assign;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NonProcedural);
    assign = &Expression::bind(syntax->as<ExpressionSyntax>(), context,
                               ASTFlags::AssignmentAllowed);

    return *assign;
}